

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O2

void __thiscall NaDynAr<NaVector>::item::~item(item *this)

{
  NaVector *pNVar1;
  
  pNVar1 = this->pData;
  if (pNVar1 == (NaVector *)0x0) {
    NaPrintLog("data=0x%08p removed twice\n",0);
    pNVar1 = this->pData;
    if (pNVar1 == (NaVector *)0x0) goto LAB_00148d4e;
  }
  (*pNVar1->_vptr_NaVector[1])();
LAB_00148d4e:
  this->pData = (NaVector *)0x0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }